

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O3

void __thiscall Fl_Menu_Type::write_code2(Fl_Menu_Type *this)

{
  Fl_Type *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  Fl_Type *pFVar11;
  int iVar12;
  int i;
  int local_34;
  
  pFVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
  if (pFVar1 != (Fl_Type *)0x0) {
    iVar2 = (*pFVar1->_vptr_Fl_Type[0x1e])();
    if (iVar2 != 0) {
      if (i18n_type != 0) {
        pFVar1 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
        pcVar6 = Fl_Menu_Item_Type::menu_name((Fl_Menu_Item_Type *)pFVar1,&local_34);
        pFVar11 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
        if (pFVar11 != (Fl_Type *)0x0) {
          uVar10 = 0;
          iVar2 = 0;
          do {
            iVar3 = (*pFVar11->_vptr_Fl_Type[0x1e])(pFVar11);
            if (iVar3 == 0) break;
            iVar2 = (iVar2 + 1) - (uint)(pFVar11->label_ == (char *)0x0);
            iVar3 = pFVar11->level;
            iVar4 = (*pFVar11->_vptr_Fl_Type[0x16])(pFVar11);
            iVar3 = (iVar3 + 1) - (uint)(iVar4 == 0);
            if (pFVar11->next == (Fl_Type *)0x0) {
              pFVar11 = (Fl_Type *)0x0;
LAB_0017f029:
              iVar4 = ((this->super_Fl_Widget_Type).super_Fl_Type.next)->level + 1;
            }
            else {
              iVar4 = (*pFVar11->next->_vptr_Fl_Type[0x1e])();
              pFVar11 = pFVar11->next;
              if (iVar4 == 0) goto LAB_0017f029;
              iVar4 = pFVar11->level;
            }
            iVar12 = iVar3 - iVar4;
            iVar5 = iVar12 + 1;
            if (iVar12 == 0 || iVar3 < iVar4) {
              iVar5 = 1;
            }
            uVar10 = uVar10 + iVar5;
          } while (pFVar11 != (Fl_Type *)0x0);
          if (iVar2 != 0) {
            pcVar7 = indent();
            write_c("%sif (!%s_i18n_done) {\n",pcVar7,pcVar6);
            pcVar7 = indent();
            write_c("%s  int i=0;\n",pcVar7);
            pcVar7 = indent();
            write_c("%s  for ( ; i<%d; i++)\n",pcVar7,(ulong)uVar10);
            pcVar7 = indent();
            write_c("%s    if (%s[i].label())\n",pcVar7,pcVar6);
            if (i18n_type == 2) {
              pcVar8 = indent();
              pcVar7 = i18n_set;
              pcVar9 = "_catalog";
              if (*i18n_file != '\0') {
                pcVar9 = i18n_file;
              }
              uVar10 = Fl_Type::msgnum(pFVar1);
              write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",pcVar8,pcVar6,
                      pcVar9,pcVar7,(ulong)uVar10,pcVar6);
            }
            else if (i18n_type == 1) {
              pcVar7 = indent();
              write_c("%s      %s[i].label(%s(%s[i].label()));\n",pcVar7,pcVar6,i18n_function,pcVar6
                     );
            }
            pcVar7 = indent();
            write_c("%s  %s_i18n_done = 1;\n",pcVar7,pcVar6);
            pcVar6 = indent();
            write_c("%s}\n",pcVar6);
          }
        }
      }
      pcVar9 = indent();
      pcVar6 = (this->super_Fl_Widget_Type).super_Fl_Type.name_;
      pcVar7 = "o";
      if (pcVar6 != (char *)0x0) {
        pcVar7 = pcVar6;
      }
      pcVar6 = unique_id(this,"menu",pcVar6,(this->super_Fl_Widget_Type).super_Fl_Type.label_);
      write_c("%s%s->menu(%s);\n",pcVar9,pcVar7,pcVar6);
    }
  }
  Fl_Widget_Type::write_code2(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Menu_Type::write_code2() {
  if (next && next->is_menu_item()) {
    if (i18n_type) {
      // take care of i18n now!
      Fl_Menu_Item_Type *mi = (Fl_Menu_Item_Type*)next;
      int i, nItem = 0, nLabel = 0;
      const char *mName = mi->menu_name(i);
      for (Fl_Type* q = next; q && q->is_menu_item(); q = q->next) {
        if (((Fl_Menu_Item_Type*)q)->label()) nLabel++;
	int thislevel = q->level; if (q->is_parent()) thislevel++;
	int nextlevel =
	    (q->next && q->next->is_menu_item()) ? q->next->level : next->level+1;
	nItem += 1 + ((thislevel > nextlevel) ? (thislevel-nextlevel) : 0);
      }
      if (nLabel) {
        write_c("%sif (!%s_i18n_done) {\n", indent(), mName);
        write_c("%s  int i=0;\n", indent());
        write_c("%s  for ( ; i<%d; i++)\n", indent(), nItem);
        write_c("%s    if (%s[i].label())\n", indent(), mName);
        switch (i18n_type) {
          case 1:
            write_c("%s      %s[i].label(%s(%s[i].label()));\n",
                    indent(), mName, i18n_function, mName);
            break;
          case 2:
            write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",
                    indent(), mName, i18n_file[0] ? i18n_file : "_catalog", 
                    i18n_set, mi->msgnum(), mName);
            break;
        }
        write_c("%s  %s_i18n_done = 1;\n", indent(), mName);
        write_c("%s}\n", indent());
      }
    }
    write_c("%s%s->menu(%s);\n", indent(), name() ? name() : "o",
	    unique_id(this, "menu", name(), label()));
  }
  Fl_Widget_Type::write_code2();
}